

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

GLuint piksel::compile(GLenum shaderType,string *shaderSource)

{
  long lVar1;
  GLchar *pGVar2;
  GLuint GVar3;
  undefined8 uStack_50;
  GLchar *local_48;
  ulong local_40;
  unsigned_long __vla_expr0;
  uint local_30;
  int local_2c;
  GLint infoLogLength;
  GLint compileStatus;
  GLchar *c_str;
  string *psStack_18;
  GLuint shader;
  string *shaderSource_local;
  GLenum shaderType_local;
  
  uStack_50 = 0x1a18fe;
  psStack_18 = shaderSource;
  shaderSource_local._0_4_ = shaderType;
  c_str._4_4_ = (*glad_glCreateShader)(shaderType);
  uStack_50 = 0x1a190a;
  _infoLogLength = (GLchar *)std::__cxx11::string::c_str();
  uStack_50 = 0x1a1928;
  (*glad_glShaderSource)(c_str._4_4_,1,(GLchar **)&infoLogLength,(GLint *)0x0);
  uStack_50 = 0x1a1937;
  (*glad_glCompileShader)(c_str._4_4_);
  uStack_50 = 0x1a194f;
  (*glad_glGetShaderiv)(c_str._4_4_,0x8b81,&local_2c);
  if (local_2c == 0) {
    uStack_50 = 0x1a1971;
    (*glad_glGetShaderiv)(c_str._4_4_,0x8b84,(GLint *)&local_30);
    GVar3 = c_str._4_4_;
    local_40 = (ulong)local_30;
    lVar1 = -(local_40 + 0xf & 0xfffffffffffffff0);
    local_48 = (GLchar *)((long)&local_48 + lVar1);
    __vla_expr0 = (unsigned_long)&local_48;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1a19ad;
    (*glad_glGetShaderInfoLog)
              (GVar3,local_30,(GLsizei *)&local_30,(GLchar *)((long)&local_48 + lVar1));
    GVar3 = c_str._4_4_;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1a19bc;
    (*glad_glDeleteShader)(GVar3);
    pGVar2 = local_48;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1a19d8;
    fprintf(_stderr,"Shader compilation failed: %s\n",pGVar2);
    shaderSource_local._4_4_ = 0;
  }
  else {
    shaderSource_local._4_4_ = c_str._4_4_;
  }
  return shaderSource_local._4_4_;
}

Assistant:

GLuint compile(GLenum shaderType, const std::string &shaderSource) {
    GLuint shader = glCreateShader(shaderType);
    const GLchar* c_str = shaderSource.c_str();
    glShaderSource(shader, 1, &c_str, NULL);
    glCompileShader(shader);

    GLint compileStatus;
    glGetShaderiv(shader, GL_COMPILE_STATUS, &compileStatus);
    if (compileStatus == GL_FALSE) {
        GLint infoLogLength;
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLogLength);

        GLchar infoLog[infoLogLength];
        glGetShaderInfoLog(shader, infoLogLength, &infoLogLength, infoLog);
        
        glDeleteShader(shader);

        fprintf(stderr, "Shader compilation failed: %s\n", infoLog);

        return 0;
    }

    return shader;
}